

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

PegoutKeyData *
cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
          (PegoutKeyData *__return_storage_ptr__,Pubkey *online_pubkey,Privkey *master_online_key,
          string *bitcoin_descriptor,uint32_t bip32_counter,ByteData *whitelist,NetType net_type,
          ByteData *pubkey_prefix,NetType elements_net_type,Address *descriptor_derive_address)

{
  uint uVar1;
  bool bVar2;
  undefined1 uVar3;
  size_type sVar4;
  undefined8 uVar5;
  size_t sVar6;
  ulong uVar7;
  reference pvVar8;
  string *message;
  ByteData *in_stack_fffffffffffff8e8;
  pointer *base_ext_pubkey;
  undefined4 uVar10;
  ByteData *pBVar9;
  ByteData *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  CfdError CVar12;
  allocator *paVar11;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  byte local_642;
  ByteData local_610;
  Pubkey local_5f8;
  ByteData local_5e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5c8;
  ByteData256 local_5b0;
  undefined1 local_598 [8];
  ByteData whitelist_proof;
  undefined1 local_568 [8];
  ByteData btcpubkeybytes;
  ByteData256 tweak_sum;
  string local_530 [32];
  CfdSourceLocation local_510;
  ByteData local_4f8;
  undefined1 local_4e0 [8];
  ByteData offline_pubkey_negate;
  Pubkey offline_pubkey;
  string local_4a8 [32];
  CfdSourceLocation local_488;
  uint local_46c;
  undefined1 local_468 [4];
  uint32_t index_1;
  ByteData *local_450;
  ByteData *online_pubkey_bytes;
  undefined1 local_440 [3];
  bool is_find;
  uint32_t whitelist_index;
  ExtPubkey child_xpub;
  ExtPubkey xpub;
  string local_318 [32];
  undefined1 local_2f8 [8];
  ByteData prefix;
  CfdException *except;
  allocator_type local_251;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_250;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  ByteData local_228;
  undefined1 local_210 [8];
  Pubkey online_key;
  allocator_type local_1d9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  ByteData local_1b0;
  undefined1 local_198 [8];
  Pubkey offline_key;
  uint32_t online_key_end;
  uint32_t online_key_start;
  uint32_t offline_key_end;
  uint32_t offline_key_start;
  uint32_t index;
  uint local_144;
  iterator iStack_140;
  uint32_t whitelist_count;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  const_iterator ite;
  string local_128 [39];
  byte local_101;
  Pubkey local_100;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  uint local_98;
  uint32_t whitelist_size;
  undefined1 local_88 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> whitelist_bytes;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> online_keys;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> offline_keys;
  ByteData *whitelist_local;
  uint32_t bip32_counter_local;
  string *bitcoin_descriptor_local;
  Privkey *master_online_key_local;
  Pubkey *online_pubkey_local;
  PegoutKeyData *result;
  
  PegoutKeyData::PegoutKeyData(__return_storage_ptr__);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &online_keys.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,whitelist);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  CVar12 = (CfdError)((ulong)in_stack_fffffffffffff908 >> 0x20);
  local_98 = (uint)sVar4;
  if ((local_98 == 0) || ((int)((sVar4 & 0xffffffff) % 0x42) != 0)) {
    local_ba = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"whitelist length error.",&local_b9);
    CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),CVar12,
               in_stack_fffffffffffff900);
    local_ba = 0;
    __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (1000000000 < bip32_counter) {
    local_e2 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e0,"bip32_counter over error.",&local_e1);
    CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),CVar12,
               in_stack_fffffffffffff900);
    local_e2 = 0;
    __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_101 = 0;
  bVar2 = Pubkey::IsValid(online_pubkey);
  local_642 = 1;
  if (bVar2) {
    bVar2 = Privkey::IsValid(master_online_key);
    local_642 = 1;
    if (bVar2) {
      Privkey::GeneratePubkey(&local_100,master_online_key,true);
      local_101 = 1;
      bVar2 = Pubkey::Equals(&local_100,online_pubkey);
      local_642 = bVar2 ^ 0xff;
    }
  }
  if ((local_101 & 1) != 0) {
    Pubkey::~Pubkey((Pubkey *)0x4e8d9c);
  }
  CVar12 = (CfdError)((ulong)in_stack_fffffffffffff908 >> 0x20);
  if ((local_642 & 1) != 0) {
    ite._M_current._6_1_ = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_128,"Illegal online key error.",(allocator *)((long)&ite._M_current + 7));
    CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),CVar12,
               in_stack_fffffffffffff900);
    ite._M_current._6_1_ = 0;
    __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iStack_140 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_138,&stack0xfffffffffffffec0);
  CVar12 = (CfdError)((ulong)in_stack_fffffffffffff908 >> 0x20);
  local_144 = local_98 / 0x42;
  if (0x100 < local_144) {
    offline_key_start._2_1_ = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&index,"Illegal whitelist maximum error.",
               (allocator *)((long)&offline_key_start + 3));
    CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),CVar12,
               in_stack_fffffffffffff900);
    offline_key_start._2_1_ = 0;
    __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  for (offline_key_end = 0; offline_key_end < local_144; offline_key_end = offline_key_end + 1) {
    uVar1 = offline_key_end * 0x42;
    offline_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar1 + 0x21;
    offline_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = offline_key_end * 0x42 + 0x42;
    local_1d0 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,(ulong)uVar1);
    local_1d8 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,(ulong)(uVar1 + 0x21));
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4e90b3);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1c8,local_1d0,local_1d8
               ,&local_1d9);
    ByteData::ByteData(&local_1b0,&local_1c8);
    Pubkey::Pubkey((Pubkey *)local_198,&local_1b0);
    ByteData::~ByteData((ByteData *)0x4e910c);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff900);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4e9124);
    Pubkey::GetData((ByteData *)
                    &online_key.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_198);
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &online_keys.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               &online_key.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)0x4e9157);
    local_248 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,
                            (ulong)offline_key.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_250 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_138,
                            (ulong)(uint)offline_key.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4e91a7);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_240,local_248,local_250
               ,&local_251);
    ByteData::ByteData(&local_228,&local_240);
    Pubkey::Pubkey((Pubkey *)local_210,&local_228);
    ByteData::~ByteData((ByteData *)0x4e9200);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff900);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4e9218);
    Pubkey::GetData((ByteData *)&except,(Pubkey *)local_210);
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&except);
    ByteData::~ByteData((ByteData *)0x4e924b);
    Pubkey::~Pubkey((Pubkey *)0x4e9257);
    Pubkey::~Pubkey((Pubkey *)0x4e9263);
  }
  ByteData::ByteData(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  bVar2 = ByteData::IsEmpty(pubkey_prefix);
  if ((!bVar2) || (((net_type != kTestnet && (net_type != kRegtest)) && (net_type != kMainnet)))) {
    sVar6 = ByteData::GetDataSize((ByteData *)local_2f8);
    CVar12 = (CfdError)((ulong)in_stack_fffffffffffff908 >> 0x20);
    if (sVar6 != 4) {
      xpub.super_Extkey.tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_318,"Illegal prefix and nettype.",
                 (allocator *)
                 ((long)&xpub.super_Extkey.tweak_sum_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 0x17));
      CfdException::CfdException
                ((CfdException *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 CVar12,in_stack_fffffffffffff900);
      xpub.super_Extkey.tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  ExtPubkey::ExtPubkey
            ((ExtPubkey *)
             ((long)&child_xpub.super_Extkey.tweak_sum_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  base_ext_pubkey =
       (pointer *)
       ((long)&child_xpub.super_Extkey.tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 0x10);
  GenerateExtPubkeyFromDescriptor
            ((ExtPubkey *)local_440,bitcoin_descriptor,bip32_counter,pubkey_prefix,net_type,
             elements_net_type,(ExtPubkey *)base_ext_pubkey,descriptor_derive_address);
  online_pubkey_bytes._4_4_ = 0;
  online_pubkey_bytes._3_1_ = 0;
  Pubkey::GetData((ByteData *)local_468,online_pubkey);
  local_450 = (ByteData *)local_468;
  local_46c = 0;
  do {
    uVar7 = (ulong)local_46c;
    sVar4 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                      ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                       &whitelist_bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    pBVar9 = local_450;
    uVar10 = (undefined4)((ulong)base_ext_pubkey >> 0x20);
    CVar12 = (CfdError)((ulong)in_stack_fffffffffffff908 >> 0x20);
    if (sVar4 <= uVar7) {
LAB_004e9820:
      if ((online_pubkey_bytes._3_1_ & 1) == 0) {
        local_488.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_488.filename = local_488.filename + 1;
        local_488.line = 0xd65;
        local_488.funcname = "GetPegoutPubkeyData";
        logger::warn<>(&local_488,"online_pubkey not exists.");
        offline_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        uVar5 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4a8,"online_pubkey not exists.",
                   (allocator *)
                   ((long)&offline_pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        CfdException::CfdException
                  ((CfdException *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   CVar12,in_stack_fffffffffffff900);
        offline_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      Extkey::GetPubkey((Pubkey *)
                        &offline_pubkey_negate.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (Extkey *)
                        ((long)&child_xpub.super_Extkey.tweak_sum_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data + 0x10));
      Pubkey::GetData(&local_4f8,
                      (Pubkey *)
                      &offline_pubkey_negate.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      WallyUtil::NegatePubkey((ByteData *)local_4e0,&local_4f8);
      ByteData::~ByteData((ByteData *)0x4e99a1);
      pvVar8 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          &online_keys.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)online_pubkey_bytes._4_4_);
      uVar3 = ByteData::Equals(pvVar8,(ByteData *)local_4e0);
      if (!(bool)uVar3) {
        local_510.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_510.filename = local_510.filename + 1;
        local_510.line = 0xd6d;
        local_510.funcname = "GetPegoutPubkeyData";
        logger::warn<>(&local_510,"offline_pubkey not exists.");
        tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        message = (string *)__cxa_allocate_exception(0x30);
        paVar11 = (allocator *)
                  ((long)&tweak_sum.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_530,"offline_pubkey not exists.",paVar11);
        CfdException::CfdException
                  ((CfdException *)CONCAT17(uVar3,in_stack_fffffffffffff910),
                   (CfdError)((ulong)paVar11 >> 0x20),message);
        tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
      }
      Extkey::GetPubTweakSum
                ((ByteData256 *)
                 &btcpubkeybytes.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Extkey *)local_440);
      Pubkey::GetData((ByteData *)
                      &whitelist_proof.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (Pubkey *)
                      &offline_pubkey_negate.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      WallyUtil::AddTweakPubkey
                ((ByteData *)local_568,
                 (ByteData *)
                 &whitelist_proof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (ByteData256 *)
                 &btcpubkeybytes.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,false);
      ByteData::~ByteData((ByteData *)0x4e9ba7);
      Privkey::GetData(&local_5e0,master_online_key);
      ByteData::GetBytes(&local_5c8,&local_5e0);
      ByteData256::ByteData256(&local_5b0,&local_5c8);
      pBVar9 = (ByteData *)CONCAT44(uVar10,online_pubkey_bytes._4_4_);
      WallyUtil::SignWhitelist
                ((ByteData *)local_598,(ByteData *)local_568,&local_5b0,
                 (ByteData256 *)
                 &btcpubkeybytes.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &whitelist_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &online_keys.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,online_pubkey_bytes._4_4_);
      ByteData256::~ByteData256((ByteData256 *)0x4e9c25);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff900)
      ;
      ByteData::~ByteData((ByteData *)0x4e9c3d);
      ByteData::ByteData((ByteData *)descriptor_derive_address,pBVar9);
      Pubkey::Pubkey(&local_5f8,&local_610);
      Pubkey::operator=(&__return_storage_ptr__->btc_pubkey_bytes,&local_5f8);
      Pubkey::~Pubkey((Pubkey *)0x4e9c88);
      ByteData::~ByteData((ByteData *)0x4e9c94);
      ByteData::operator=(&__return_storage_ptr__->whitelist_proof,(ByteData *)local_598);
      ByteData::~ByteData((ByteData *)0x4e9cbd);
      ByteData::~ByteData((ByteData *)0x4e9cc9);
      ByteData256::~ByteData256((ByteData256 *)0x4e9cd5);
      ByteData::~ByteData((ByteData *)0x4e9ce1);
      Pubkey::~Pubkey((Pubkey *)0x4e9ced);
      ByteData::~ByteData((ByteData *)0x4e9cf9);
      ExtPubkey::~ExtPubkey((ExtPubkey *)0x4e9d05);
      ExtPubkey::~ExtPubkey((ExtPubkey *)0x4e9d11);
      ByteData::~ByteData((ByteData *)0x4e9d1d);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff900)
      ;
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 in_stack_fffffffffffff900);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 in_stack_fffffffffffff900);
      return __return_storage_ptr__;
    }
    pvVar8 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        &whitelist_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ulong)local_46c);
    bVar2 = ByteData::Equals(pBVar9,pvVar8);
    uVar10 = (undefined4)((ulong)base_ext_pubkey >> 0x20);
    CVar12 = (CfdError)((ulong)in_stack_fffffffffffff908 >> 0x20);
    if (bVar2) {
      online_pubkey_bytes._4_4_ = local_46c;
      online_pubkey_bytes._3_1_ = 1;
      goto LAB_004e9820;
    }
    local_46c = local_46c + 1;
  } while( true );
}

Assistant:

PegoutKeyData ConfidentialTransaction::GetPegoutPubkeyData(
    const Pubkey &online_pubkey, const Privkey &master_online_key,
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &whitelist, NetType net_type, const ByteData &pubkey_prefix,
    NetType elements_net_type, Address *descriptor_derive_address) {
  static constexpr uint32_t kPegoutBip32CountMaximum = 1000000000;
  static constexpr uint32_t kWhitelistCountMaximum = 256;
  static constexpr uint32_t kPubkeySize = Pubkey::kCompressedPubkeySize;
  static constexpr uint32_t kWhitelistSingleSize = kPubkeySize * 2;
  PegoutKeyData result;
  std::vector<ByteData> offline_keys;
  std::vector<ByteData> online_keys;
  std::vector<uint8_t> whitelist_bytes = whitelist.GetBytes();
  uint32_t whitelist_size = static_cast<uint32_t>(whitelist_bytes.size());

  if ((whitelist_size == 0) ||
      ((whitelist_size % kWhitelistSingleSize) != 0)) {
    throw CfdException(kCfdIllegalArgumentError, "whitelist length error.");
  }
  // parameter check
  if (bip32_counter > kPegoutBip32CountMaximum) {
    throw CfdException(kCfdIllegalArgumentError, "bip32_counter over error.");
  }
  if ((!online_pubkey.IsValid()) || (!master_online_key.IsValid()) ||
      (!master_online_key.GeneratePubkey().Equals(online_pubkey))) {
    throw CfdException(kCfdIllegalArgumentError, "Illegal online key error.");
  }

  // CreatePAKListFromExtensionSpace
  decltype(whitelist_bytes)::const_iterator ite = whitelist_bytes.begin();
  uint32_t whitelist_count = whitelist_size / kWhitelistSingleSize;
  if (whitelist_count > kWhitelistCountMaximum) {
    throw CfdException(
        kCfdIllegalArgumentError, "Illegal whitelist maximum error.");
  }

  try {
    for (uint32_t index = 0; index < whitelist_count; ++index) {
      uint32_t offline_key_start = index * kWhitelistSingleSize;
      uint32_t offline_key_end = offline_key_start + kPubkeySize;
      uint32_t online_key_start = offline_key_start + kPubkeySize;
      uint32_t online_key_end = (index + 1) * kWhitelistSingleSize;
      Pubkey offline_key(std::vector<uint8_t>(
          ite + offline_key_start, ite + offline_key_end));
      offline_keys.push_back(offline_key.GetData());
      Pubkey online_key(
          std::vector<uint8_t>(ite + online_key_start, ite + online_key_end));
      online_keys.push_back(online_key.GetData());
    }
  } catch (const CfdException &except) {
    throw CfdException(
        kCfdIllegalArgumentError,
        "Illegal whitelist key. (" + std::string(except.what()) + ")");
  }

  ByteData prefix = pubkey_prefix;
  if (pubkey_prefix.IsEmpty() &&
      ((net_type == NetType::kTestnet) || (net_type == NetType::kRegtest) ||
       (net_type == NetType::kMainnet))) {
    // do nothing
  } else if (prefix.GetDataSize() != 4) {
    throw CfdException(
        kCfdIllegalArgumentError, "Illegal prefix and nettype.");
  }

  // check descriptor
  ExtPubkey xpub;
  ExtPubkey child_xpub = GenerateExtPubkeyFromDescriptor(
      bitcoin_descriptor, bip32_counter, pubkey_prefix, net_type,
      elements_net_type, &xpub, descriptor_derive_address);
  // FlatSigningProvider provider;
  // const auto descriptor = Parse(desc_str, provider);
  // if (!descriptor) desc_str = "pkh(" + xpub.GetBase58String() + "/0/*)";

  // check whitelist
  uint32_t whitelist_index = 0;
  bool is_find = false;
  const ByteData &online_pubkey_bytes = online_pubkey.GetData();
  for (uint32_t index = 0; index < online_keys.size(); ++index) {
    if (online_pubkey_bytes.Equals(online_keys[index])) {
      whitelist_index = index;
      is_find = true;
      break;
    }
  }
  if (!is_find) {
    warn(CFD_LOG_SOURCE, "online_pubkey not exists.");
    throw CfdException(kCfdIllegalArgumentError, "online_pubkey not exists.");
  }

  Pubkey offline_pubkey = xpub.GetPubkey();
  ByteData offline_pubkey_negate =
      WallyUtil::NegatePubkey(offline_pubkey.GetData());
  if (!offline_keys[whitelist_index].Equals(offline_pubkey_negate)) {
    warn(CFD_LOG_SOURCE, "offline_pubkey not exists.");
    throw CfdException(kCfdIllegalArgumentError, "offline_pubkey not exists.");
  }

  // calc tweak
  ByteData256 tweak_sum = child_xpub.GetPubTweakSum();
  ByteData btcpubkeybytes =
      WallyUtil::AddTweakPubkey(offline_pubkey.GetData(), tweak_sum);

  ByteData whitelist_proof = WallyUtil::SignWhitelist(
      btcpubkeybytes, ByteData256(master_online_key.GetData().GetBytes()),
      tweak_sum, online_keys, offline_keys, whitelist_index);

  result.btc_pubkey_bytes = Pubkey(btcpubkeybytes);
  result.whitelist_proof = whitelist_proof;
  return result;
}